

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O3

void * dlsym_wrapper(void *handle,char *symbol_name)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  void *pvVar5;
  void **ppvVar6;
  long lVar7;
  undefined8 uVar8;
  link_map *lib;
  internal_binding_t *binding;
  code *local_58;
  void *local_50;
  undefined1 local_48 [8];
  long local_40;
  undefined8 local_38;
  
  local_58 = (code *)gotcha_get_wrappee(orig_dlopen_handle);
  pcVar4 = (code *)gotcha_get_wrappee(orig_dlsym_handle);
  __stream = _stderr;
  binding = (internal_binding_t *)0x0;
  if (0 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    fprintf(__stream,"[%d/%d][%s:%u] - User called dlsym(%p, %s)\n",(ulong)uVar2,(ulong)uVar3,
            "gotcha_dl.c",0xa0,handle,symbol_name);
  }
  iVar1 = lookup_hashtable(&function_hash_table,symbol_name,&binding);
  pvVar5 = (void *)(*pcVar4)(handle,symbol_name);
  if ((iVar1 == -1) ||
     ((ppvVar6 = getInternalBindingAddressPointer
                           ((internal_binding_t **)binding->user_binding->function_handle),
      pvVar5 != (void *)0x0 && (*ppvVar6 != pvVar5)))) {
    if (handle == (void *)0xffffffffffffffff) {
      local_38 = 0;
      local_40 = ___throw_regex_error;
      local_50 = (void *)0x0;
      dl_iterate_phdr(lib_header_callback,local_48);
      if ((int)local_38 == 0) {
        if (debug_level != 0) {
          dlsym_wrapper_cold_3();
        }
        exit(0x7f);
      }
      lib = *(link_map **)(local_40 + 0x18);
      if (lib != (link_map *)0x0) {
        do {
          lVar7 = lookup_exported_symbol(symbol_name,lib,&local_50);
          if (lVar7 != -1) {
            uVar8 = (*local_58)(lib->l_name,2);
            pvVar5 = (void *)(*pcVar4)(uVar8,symbol_name);
            return pvVar5;
          }
          if (2 < debug_level) {
            dlsym_wrapper_cold_1();
          }
          lib = lib->l_next;
        } while (lib != (link_map *)0x0);
      }
      if (2 < debug_level) {
        dlsym_wrapper_cold_2();
      }
      pvVar5 = (void *)0x0;
    }
  }
  else {
    pvVar5 = binding->user_binding->wrapper_pointer;
  }
  return pvVar5;
}

Assistant:

static void *dlsym_wrapper(void *handle, const char *symbol_name) {
  typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
  typeof(&dlsym_wrapper) orig_dlsym = gotcha_get_wrappee(orig_dlsym_handle);
  struct internal_binding_t *binding = NULL;
  debug_printf(1, "User called dlsym(%p, %s)\n", handle, symbol_name);
  int result = lookup_hashtable(&function_hash_table, (hash_key_t)symbol_name,
                                (hash_data_t *)&binding);
  void *val = orig_dlsym(handle, symbol_name);
  if (result != -1) {
    void **wrappee_ptr = getInternalBindingAddressPointer(
        (struct internal_binding_t **)binding->user_binding->function_handle);
    if (val == NULL || *wrappee_ptr == val) {
      // if the wrapper is found and the wrappee is the function requested.
      // This is needed in cases where we wrap a function F1 from library A and
      // we dynamically load function F1 from library B. As name is same, we
      // need to make sure the wrappee are the same as well
      return binding->user_binding->wrapper_pointer;
    }
  }
  if (handle == RTLD_NEXT) {
    struct link_map *lib = gotchas_dlsym_rtld_next_lookup(
        symbol_name, __builtin_return_address(0));
    if (lib) {
      void *handle = orig_dlopen(lib->l_name, RTLD_NOW);
      void *symbol = orig_dlsym(handle, symbol_name);
      return symbol;
    }
    return NULL;
  } else {
    return val;
  }
}